

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O3

sexp_conflict
sexp_ioctl_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
               sexp_conflict arg1)

{
  sexp psVar1;
  int iVar2;
  sexp_conflict psVar3;
  void *pvVar4;
  sexp_uint_t __request;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp_conflict)0x43e;
  if (((ulong)arg0 & 3) == 0) {
    if (2 < arg0->tag - 0x10) goto LAB_00102511;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_00102511:
    psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a port or file descriptor",arg0);
    return psVar3;
  }
  if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
    return psVar3;
  }
  local_38.var = &local_40;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  pvVar4 = calloc(1,9);
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag - 0x10 < 2) {
      psVar1 = (arg0->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (arg0->value).type.slots;
        iVar2 = -1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          iVar2 = (int)(psVar1->value).fileno.fd;
        }
      }
      else {
        iVar2 = fileno((FILE *)psVar1);
      }
      goto LAB_0010258b;
    }
    if (arg0->tag == 0x12) {
      iVar2 = (int)(arg0->value).fileno.fd;
      goto LAB_0010258b;
    }
  }
  iVar2 = (int)((long)arg0 >> 1);
LAB_0010258b:
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      __request = (arg1->value).string.length;
    }
    else {
      __request = 0;
    }
  }
  else {
    __request = (long)arg1 >> 1;
  }
  iVar2 = ioctl(iVar2,__request,pvVar4);
  psVar3 = (sexp_conflict)0x3e;
  if (iVar2 == 0) {
    psVar3 = (sexp_conflict)sexp_make_cpointer(ctx,(long)(self->value).type.dl >> 1,pvVar4,0x3e,1);
  }
  (ctx->value).context.saves = local_38.next;
  return psVar3;
}

Assistant:

sexp sexp_ioctl_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  struct winsize* tmp2;
  sexp res;
  sexp_gc_var1(res2);
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  sexp_gc_preserve1(ctx, res2);
  tmp2 = (struct winsize*) calloc(1, 1 + sizeof(tmp2[0]));
  err = ioctl((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), sexp_uint_value(arg1), tmp2);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res2 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg3_type(self)), tmp2, SEXP_FALSE, 1);
  res = res2;
  }
  sexp_gc_release1(ctx);
  return res;
}